

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O3

void __thiscall leveldb::TableBuilder::Rep::Rep(Rep *this,Options *opt,WritableFile *f)

{
  FilterPolicy *policy;
  FilterBlockBuilder *this_00;
  long lVar1;
  Options *pOVar2;
  Rep *pRVar3;
  Options *pOVar4;
  
  pOVar2 = opt;
  pRVar3 = this;
  for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pRVar3->options).comparator = pOVar2->comparator;
    pOVar2 = (Options *)&pOVar2->create_if_missing;
    pRVar3 = (Rep *)&(pRVar3->options).create_if_missing;
  }
  pOVar2 = opt;
  pOVar4 = &this->index_block_options;
  for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
    pOVar4->comparator = pOVar2->comparator;
    pOVar2 = (Options *)&pOVar2->create_if_missing;
    pOVar4 = (Options *)&pOVar4->create_if_missing;
  }
  this->file = f;
  this->offset = 0;
  this->status = (char *)0x0;
  BlockBuilder::BlockBuilder(&this->data_block,&this->options);
  BlockBuilder::BlockBuilder(&this->index_block,&this->index_block_options);
  (this->last_key)._M_dataplus._M_p = (pointer)&(this->last_key).field_2;
  this_00 = (FilterBlockBuilder *)0x0;
  (this->last_key)._M_string_length = 0;
  (this->last_key).field_2._M_local_buf[0] = '\0';
  this->num_entries = 0;
  this->closed = false;
  policy = opt->filter_policy;
  if (policy != (FilterPolicy *)0x0) {
    this_00 = (FilterBlockBuilder *)operator_new(0x90);
    FilterBlockBuilder::FilterBlockBuilder(this_00,policy);
  }
  this->filter_block = this_00;
  this->pending_index_entry = false;
  *(undefined4 *)&(this->pending_handle).offset_ = 0xffffffff;
  *(undefined4 *)((long)&(this->pending_handle).offset_ + 4) = 0xffffffff;
  *(undefined4 *)&(this->pending_handle).size_ = 0xffffffff;
  *(undefined4 *)((long)&(this->pending_handle).size_ + 4) = 0xffffffff;
  (this->compressed_output)._M_dataplus._M_p = (pointer)&(this->compressed_output).field_2;
  (this->compressed_output)._M_string_length = 0;
  (this->compressed_output).field_2._M_local_buf[0] = '\0';
  (this->index_block_options).block_restart_interval = 1;
  return;
}

Assistant:

Rep(const Options& opt, WritableFile* f)
      : options(opt),
        index_block_options(opt),
        file(f),
        offset(0),
        data_block(&options),
        index_block(&index_block_options),
        num_entries(0),
        closed(false),
        filter_block(opt.filter_policy == nullptr
                         ? nullptr
                         : new FilterBlockBuilder(opt.filter_policy)),
        pending_index_entry(false) {
    index_block_options.block_restart_interval = 1;
  }